

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon.cpp
# Opt level: O3

void __thiscall QSystemTrayIconPrivate::remove_sys_qpa(QSystemTrayIconPrivate *this)

{
  long in_FS_OFFSET;
  code *local_30;
  undefined8 local_28;
  code *local_20;
  undefined8 local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::disconnect((QObject *)this->qpa_sys,
                      "2activated(QPlatformSystemTrayIcon::ActivationReason)",
                      *(QObject **)&this->field_0x8,
                      "1_q_emitActivated(QPlatformSystemTrayIcon::ActivationReason)");
  local_20 = QPlatformSystemTrayIcon::messageClicked;
  local_18 = 0;
  local_30 = QSystemTrayIcon::messageClicked;
  local_28 = 0;
  QObject::disconnectImpl
            ((QObject *)this->qpa_sys,&local_20,*(QObject **)&this->field_0x8,&local_30,
             (QMetaObject *)&QPlatformSystemTrayIcon::staticMetaObject);
  (**(code **)(*(long *)this->qpa_sys + 0x68))();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSystemTrayIconPrivate::remove_sys_qpa()
{
    QObject::disconnect(qpa_sys, SIGNAL(activated(QPlatformSystemTrayIcon::ActivationReason)),
                        q_func(), SLOT(_q_emitActivated(QPlatformSystemTrayIcon::ActivationReason)));
    QObject::disconnect(qpa_sys, &QPlatformSystemTrayIcon::messageClicked,
                        q_func(), &QSystemTrayIcon::messageClicked);
    qpa_sys->cleanup();
}